

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# islamcal.cpp
# Opt level: O2

int32_t __thiscall
icu_63::IslamicCalendar::handleGetMonthLength
          (IslamicCalendar *this,int32_t extendedYear,int32_t month)

{
  int32_t iVar1;
  int32_t iVar2;
  int iVar3;
  
  switch(*(undefined4 *)&(this->super_Calendar).field_0x264) {
  case 0:
    iVar1 = trueMonthStart(this,extendedYear * 0xc + month + -0xb);
    iVar2 = trueMonthStart(this,extendedYear * 0xc + month + -0xc);
    return iVar1 - iVar2;
  case 2:
    if (0xfffffed2 < extendedYear - 0x641U) goto switchD_001f11c7_default;
  case 1:
  case 3:
    iVar3 = (month + 1) % 2 + 0x1d;
    if ((month == 0xb) && ((extendedYear * 0xb + 0xe) % 0x1e < 0xb)) {
      iVar3 = 0x1e;
    }
    break;
  default:
switchD_001f11c7_default:
    iVar3 = ((*(uint *)(Calendar::kDOWPrecedence + (long)extendedYear * 4 + 0x2c0) >>
              ((byte)(0xb - (char)month) & 0x1f) & 1) != 0) + 0x1d;
  }
  return iVar3;
}

Assistant:

int32_t IslamicCalendar::handleGetMonthLength(int32_t extendedYear, int32_t month) const {

    int32_t length = 0;

    if (cType == CIVIL || cType == TBLA ||
        (cType == UMALQURA && (extendedYear<UMALQURA_YEAR_START || extendedYear>UMALQURA_YEAR_END)) ) {
        length = 29 + (month+1) % 2;
        if (month == DHU_AL_HIJJAH && civilLeapYear(extendedYear)) {
            length++;
        }
    } else if(cType == ASTRONOMICAL){
        month = 12*(extendedYear-1) + month;
        length =  trueMonthStart(month+1) - trueMonthStart(month) ;
    } else {
        length = getUmalqura_MonthLength(extendedYear - UMALQURA_YEAR_START, month);
    }
    return length;
}